

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O3

REF_STATUS ref_subdiv_split_tri(REF_SUBDIV ref_subdiv)

{
  size_t __size;
  REF_CELL pRVar1;
  REF_CELL pRVar2;
  uint uVar3;
  REF_STATUS RVar4;
  void *__s;
  REF_INT *pRVar5;
  ulong uVar6;
  int iVar7;
  undefined8 uVar8;
  REF_INT RVar9;
  int iVar10;
  long lVar11;
  char *pcVar12;
  REF_INT new_cell;
  REF_CELL tri_split;
  REF_INT edge20;
  REF_CELL qua_split;
  REF_INT edge12;
  REF_INT nodes [27];
  REF_INT edge01;
  REF_INT local_13c;
  REF_CELL local_138;
  int local_12c;
  REF_CELL local_128;
  int local_11c;
  REF_INT local_118;
  REF_INT local_114;
  REF_INT local_110;
  int local_ac;
  REF_INT local_a8;
  REF_INT local_a4;
  REF_INT local_a0;
  REF_INT RStack_9c;
  REF_INT local_98;
  REF_CELL local_38;
  
  pRVar1 = ref_subdiv->grid->cell[3];
  iVar10 = pRVar1->max;
  if ((long)iVar10 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x476,
           "ref_subdiv_split_tri","malloc marked_for_removal of REF_INT negative");
    uVar3 = 1;
  }
  else {
    __size = (long)iVar10 * 4;
    __s = malloc(__size);
    if (__s == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x476,"ref_subdiv_split_tri","malloc marked_for_removal of REF_INT NULL");
      uVar3 = 2;
    }
    else {
      if (iVar10 != 0) {
        memset(__s,0,__size);
      }
      uVar3 = ref_cell_create(&local_138,pRVar1->type);
      if (uVar3 == 0) {
        pRVar2 = ref_subdiv->grid->cell[6];
        uVar3 = ref_cell_create(&local_128,pRVar2->type);
        if (uVar3 == 0) {
          local_38 = pRVar2;
          if (0 < pRVar1->max) {
            lVar11 = 0;
            do {
              iVar10 = (int)lVar11;
              if (pRVar1->c2n[(long)iVar10 * (long)pRVar1->size_per] == -1) goto LAB_002082a9;
              uVar3 = ref_cell_nodes(pRVar1,iVar10,&local_118);
              if (uVar3 != 0) {
                pcVar12 = "nodes";
                uVar8 = 0x47e;
                goto LAB_00207a31;
              }
              uVar3 = ref_edge_with(ref_subdiv->edge,local_118,local_114,&local_ac);
              if (uVar3 != 0) {
                pcVar12 = "e01";
                uVar8 = 0x480;
                goto LAB_00207a31;
              }
              uVar3 = ref_edge_with(ref_subdiv->edge,local_114,local_110,&local_11c);
              if (uVar3 != 0) {
                pcVar12 = "e12";
                uVar8 = 0x482;
                goto LAB_00207a31;
              }
              uVar3 = ref_edge_with(ref_subdiv->edge,local_110,local_118,&local_12c);
              if (uVar3 != 0) {
                pcVar12 = "e20";
                uVar8 = 0x484;
                goto LAB_00207a31;
              }
              pRVar5 = ref_subdiv->mark;
              iVar7 = pRVar5[local_11c];
              if (pRVar5[local_ac] == 0) {
                if (iVar7 == 0) {
                  if (pRVar5[local_12c] == 0) {
                    iVar7 = 0;
                    goto LAB_0020812d;
                  }
                }
                else {
                  if (pRVar5[local_12c] != 0) {
                    *(undefined4 *)((long)__s + lVar11 * 4) = 1;
                    uVar3 = ref_cell_nodes(pRVar1,iVar10,&local_a8);
                    if (uVar3 == 0) {
                      uVar3 = ref_subdiv_node_between(ref_subdiv,local_110,local_114,&local_a4);
                      if (uVar3 == 0) {
                        uVar3 = ref_subdiv_node_between(ref_subdiv,local_110,local_118,&local_a8);
                        if (uVar3 == 0) {
                          uVar3 = ref_cell_add(local_138,&local_a8,&local_13c);
                          if (uVar3 == 0) {
                            uVar3 = ref_cell_nodes(pRVar1,iVar10,&local_a8);
                            if (uVar3 == 0) {
                              local_98 = RStack_9c;
                              uVar3 = ref_subdiv_node_between
                                                (ref_subdiv,local_110,local_114,&local_a0);
                              if (uVar3 == 0) {
                                uVar3 = ref_subdiv_node_between
                                                  (ref_subdiv,local_110,local_118,&RStack_9c);
                                if (uVar3 == 0) {
                                  uVar3 = ref_cell_add(local_128,&local_a8,&local_13c);
                                  if (uVar3 == 0) goto LAB_002082a9;
                                  pcVar12 = "add";
                                  uVar8 = 0x4ec;
                                }
                                else {
                                  pcVar12 = "mis";
                                  uVar8 = 0x4eb;
                                }
                              }
                              else {
                                pcVar12 = "mis";
                                uVar8 = 0x4e8;
                              }
                            }
                            else {
                              pcVar12 = "nodes";
                              uVar8 = 0x4e4;
                            }
                          }
                          else {
                            pcVar12 = "add";
                            uVar8 = 0x4e2;
                          }
                        }
                        else {
                          pcVar12 = "mis";
                          uVar8 = 0x4e1;
                        }
                      }
                      else {
                        pcVar12 = "mis";
                        uVar8 = 0x4de;
                      }
                    }
                    else {
                      pcVar12 = "nodes";
                      uVar8 = 0x4db;
                    }
                    goto LAB_00207a31;
                  }
LAB_0020812d:
                  if (iVar7 != 0) {
                    *(undefined4 *)((long)__s + lVar11 * 4) = 1;
                    uVar3 = ref_cell_nodes(pRVar1,iVar10,&local_a8);
                    if (uVar3 != 0) {
                      pcVar12 = "nodes";
                      uVar8 = 0x519;
                      goto LAB_00207a31;
                    }
                    uVar3 = ref_subdiv_node_between(ref_subdiv,local_114,local_110,&local_a4);
                    if (uVar3 != 0) {
                      pcVar12 = "mis";
                      uVar8 = 0x51c;
                      goto LAB_00207a31;
                    }
                    uVar3 = ref_cell_add(local_138,&local_a8,&local_13c);
                    if (uVar3 != 0) {
                      pcVar12 = "add";
                      uVar8 = 0x51d;
                      goto LAB_00207a31;
                    }
                    uVar3 = ref_cell_nodes(pRVar1,iVar10,&local_a8);
                    if (uVar3 != 0) {
                      pcVar12 = "nodes";
                      uVar8 = 0x51e;
                      goto LAB_00207a31;
                    }
                    uVar3 = ref_subdiv_node_between(ref_subdiv,local_114,local_110,&local_a0);
                    if (uVar3 != 0) {
                      pcVar12 = "mis";
                      uVar8 = 0x521;
                      goto LAB_00207a31;
                    }
                    uVar3 = ref_cell_add(local_138,&local_a8,&local_13c);
                    if (uVar3 != 0) {
                      pcVar12 = "add";
                      uVar8 = 0x522;
                      goto LAB_00207a31;
                    }
                    pRVar5 = ref_subdiv->mark;
                  }
                }
                if (pRVar5[local_12c] != 0) {
                  *(undefined4 *)((long)__s + lVar11 * 4) = 1;
                  uVar3 = ref_cell_nodes(pRVar1,iVar10,&local_a8);
                  if (uVar3 != 0) {
                    pcVar12 = "nodes";
                    uVar8 = 0x527;
                    goto LAB_00207a31;
                  }
                  uVar3 = ref_subdiv_node_between(ref_subdiv,local_110,local_118,&local_a0);
                  if (uVar3 != 0) {
                    pcVar12 = "mis";
                    uVar8 = 0x52a;
                    goto LAB_00207a31;
                  }
                  uVar3 = ref_cell_add(local_138,&local_a8,&local_13c);
                  if (uVar3 != 0) {
                    pcVar12 = "add";
                    uVar8 = 0x52b;
                    goto LAB_00207a31;
                  }
                  uVar3 = ref_cell_nodes(pRVar1,iVar10,&local_a8);
                  if (uVar3 != 0) {
                    pcVar12 = "nodes";
                    uVar8 = 0x52c;
                    goto LAB_00207a31;
                  }
                  uVar3 = ref_subdiv_node_between(ref_subdiv,local_110,local_118,&local_a8);
                  if (uVar3 != 0) {
                    pcVar12 = "mis";
                    uVar8 = 0x52f;
                    goto LAB_00207a31;
                  }
                  uVar3 = ref_cell_add(local_138,&local_a8,&local_13c);
                  if (uVar3 != 0) {
                    pcVar12 = "add";
                    uVar8 = 0x530;
                    goto LAB_00207a31;
                  }
                }
              }
              else if (iVar7 == 0) {
                if (pRVar5[local_12c] == 0) {
LAB_00208070:
                  *(undefined4 *)((long)__s + lVar11 * 4) = 1;
                  uVar3 = ref_cell_nodes(pRVar1,iVar10,&local_a8);
                  if (uVar3 == 0) {
                    uVar3 = ref_subdiv_node_between(ref_subdiv,local_118,local_114,&local_a8);
                    if (uVar3 == 0) {
                      uVar3 = ref_cell_add(local_138,&local_a8,&local_13c);
                      if (uVar3 == 0) {
                        uVar3 = ref_cell_nodes(pRVar1,iVar10,&local_a8);
                        if (uVar3 == 0) {
                          uVar3 = ref_subdiv_node_between(ref_subdiv,local_118,local_114,&local_a4);
                          if (uVar3 == 0) {
                            uVar3 = ref_cell_add(local_138,&local_a8,&local_13c);
                            if (uVar3 == 0) {
                              pRVar5 = ref_subdiv->mark;
                              iVar7 = pRVar5[local_11c];
                              goto LAB_0020812d;
                            }
                            pcVar12 = "add";
                            uVar8 = 0x514;
                          }
                          else {
                            pcVar12 = "mis";
                            uVar8 = 0x513;
                          }
                        }
                        else {
                          pcVar12 = "nodes";
                          uVar8 = 0x510;
                        }
                      }
                      else {
                        pcVar12 = "add";
                        uVar8 = 0x50f;
                      }
                    }
                    else {
                      pcVar12 = "mis";
                      uVar8 = 0x50e;
                    }
                  }
                  else {
                    pcVar12 = "nodes";
                    uVar8 = 0x50b;
                  }
                  goto LAB_00207a31;
                }
                *(undefined4 *)((long)__s + lVar11 * 4) = 1;
                uVar3 = ref_cell_nodes(pRVar1,iVar10,&local_a8);
                if (uVar3 != 0) {
                  pcVar12 = "nodes";
                  uVar8 = 0x4f4;
                  goto LAB_00207a31;
                }
                uVar3 = ref_subdiv_node_between(ref_subdiv,local_118,local_114,&local_a4);
                if (uVar3 != 0) {
                  pcVar12 = "mis";
                  uVar8 = 0x4f7;
                  goto LAB_00207a31;
                }
                uVar3 = ref_subdiv_node_between(ref_subdiv,local_118,local_110,&local_a0);
                if (uVar3 != 0) {
                  pcVar12 = "mis";
                  uVar8 = 0x4fa;
                  goto LAB_00207a31;
                }
                uVar3 = ref_cell_add(local_138,&local_a8,&local_13c);
                if (uVar3 != 0) {
                  pcVar12 = "add";
                  uVar8 = 0x4fb;
                  goto LAB_00207a31;
                }
                uVar3 = ref_cell_nodes(pRVar1,iVar10,&local_a8);
                if (uVar3 != 0) {
                  pcVar12 = "nodes";
                  uVar8 = 0x4fd;
                  goto LAB_00207a31;
                }
                local_98 = RStack_9c;
                uVar3 = ref_subdiv_node_between(ref_subdiv,local_118,local_114,&local_a8);
                if (uVar3 != 0) {
                  pcVar12 = "mis";
                  uVar8 = 0x501;
                  goto LAB_00207a31;
                }
                uVar3 = ref_subdiv_node_between(ref_subdiv,local_118,local_110,&RStack_9c);
                if (uVar3 != 0) {
                  pcVar12 = "mis";
                  uVar8 = 0x504;
                  goto LAB_00207a31;
                }
                uVar3 = ref_cell_add(local_128,&local_a8,&local_13c);
                if (uVar3 != 0) {
                  pcVar12 = "add";
                  uVar8 = 0x505;
                  goto LAB_00207a31;
                }
              }
              else if (pRVar5[local_12c] == 0) {
                if (pRVar5[local_12c] != 0) goto LAB_00208070;
                *(undefined4 *)((long)__s + lVar11 * 4) = 1;
                uVar3 = ref_cell_nodes(pRVar1,iVar10,&local_a8);
                if (uVar3 != 0) {
                  pcVar12 = "nodes";
                  uVar8 = 0x4c1;
                  goto LAB_00207a31;
                }
                uVar3 = ref_subdiv_node_between(ref_subdiv,local_114,local_110,&local_a0);
                if (uVar3 != 0) {
                  pcVar12 = "mis";
                  uVar8 = 0x4c4;
                  goto LAB_00207a31;
                }
                uVar3 = ref_subdiv_node_between(ref_subdiv,local_114,local_118,&local_a8);
                if (uVar3 != 0) {
                  pcVar12 = "mis";
                  uVar8 = 0x4c7;
                  goto LAB_00207a31;
                }
                uVar3 = ref_cell_add(local_138,&local_a8,&local_13c);
                if (uVar3 != 0) {
                  pcVar12 = "add";
                  uVar8 = 0x4c8;
                  goto LAB_00207a31;
                }
                uVar3 = ref_cell_nodes(pRVar1,iVar10,&local_a8);
                RVar9 = RStack_9c;
                if (uVar3 != 0) {
                  pcVar12 = "nodes";
                  uVar8 = 0x4ca;
                  goto LAB_00207a31;
                }
                RStack_9c = local_a0;
                local_98 = RVar9;
                uVar3 = ref_subdiv_node_between(ref_subdiv,local_114,local_110,&local_a0);
                if (uVar3 != 0) {
                  pcVar12 = "mis";
                  uVar8 = 0x4cf;
                  goto LAB_00207a31;
                }
                uVar3 = ref_subdiv_node_between(ref_subdiv,local_114,local_118,&local_a4);
                if (uVar3 != 0) {
                  pcVar12 = "mis";
                  uVar8 = 0x4d2;
                  goto LAB_00207a31;
                }
                uVar3 = ref_cell_add(local_128,&local_a8,&local_13c);
                if (uVar3 != 0) {
                  pcVar12 = "add";
                  uVar8 = 0x4d3;
                  goto LAB_00207a31;
                }
              }
              else {
                *(undefined4 *)((long)__s + lVar11 * 4) = 1;
                uVar3 = ref_cell_nodes(pRVar1,iVar10,&local_a8);
                if (uVar3 != 0) {
                  pcVar12 = "nodes";
                  uVar8 = 0x48b;
                  goto LAB_00207a31;
                }
                uVar3 = ref_subdiv_node_between(ref_subdiv,local_118,local_114,&local_a4);
                if (uVar3 != 0) {
                  pcVar12 = "mis";
                  uVar8 = 0x48e;
                  goto LAB_00207a31;
                }
                uVar3 = ref_subdiv_node_between(ref_subdiv,local_118,local_110,&local_a0);
                if (uVar3 != 0) {
                  pcVar12 = "mis";
                  uVar8 = 0x491;
                  goto LAB_00207a31;
                }
                uVar3 = ref_cell_add(local_138,&local_a8,&local_13c);
                if (uVar3 != 0) {
                  pcVar12 = "add";
                  uVar8 = 0x492;
                  goto LAB_00207a31;
                }
                uVar3 = ref_cell_nodes(pRVar1,iVar10,&local_a8);
                if (uVar3 != 0) {
                  pcVar12 = "nodes";
                  uVar8 = 0x495;
                  goto LAB_00207a31;
                }
                uVar3 = ref_subdiv_node_between(ref_subdiv,local_114,local_118,&local_a8);
                if (uVar3 != 0) {
                  pcVar12 = "mis";
                  uVar8 = 0x498;
                  goto LAB_00207a31;
                }
                uVar3 = ref_subdiv_node_between(ref_subdiv,local_114,local_110,&local_a0);
                if (uVar3 != 0) {
                  pcVar12 = "mis";
                  uVar8 = 0x49b;
                  goto LAB_00207a31;
                }
                uVar3 = ref_cell_add(local_138,&local_a8,&local_13c);
                if (uVar3 != 0) {
                  pcVar12 = "add";
                  uVar8 = 0x49c;
                  goto LAB_00207a31;
                }
                uVar3 = ref_cell_nodes(pRVar1,iVar10,&local_a8);
                if (uVar3 != 0) {
                  pcVar12 = "nodes";
                  uVar8 = 0x49f;
                  goto LAB_00207a31;
                }
                uVar3 = ref_subdiv_node_between(ref_subdiv,local_110,local_114,&local_a4);
                if (uVar3 != 0) {
                  pcVar12 = "mis";
                  uVar8 = 0x4a2;
                  goto LAB_00207a31;
                }
                uVar3 = ref_subdiv_node_between(ref_subdiv,local_110,local_118,&local_a8);
                if (uVar3 != 0) {
                  pcVar12 = "mis";
                  uVar8 = 0x4a5;
                  goto LAB_00207a31;
                }
                uVar3 = ref_cell_add(local_138,&local_a8,&local_13c);
                if (uVar3 != 0) {
                  pcVar12 = "add";
                  uVar8 = 0x4a6;
                  goto LAB_00207a31;
                }
                uVar3 = ref_cell_nodes(pRVar1,iVar10,&local_a8);
                if (uVar3 != 0) {
                  pcVar12 = "nodes";
                  uVar8 = 0x4a9;
                  goto LAB_00207a31;
                }
                uVar3 = ref_subdiv_node_between(ref_subdiv,local_118,local_114,&local_a8);
                if (uVar3 != 0) {
                  pcVar12 = "mis";
                  uVar8 = 0x4ac;
                  goto LAB_00207a31;
                }
                uVar3 = ref_subdiv_node_between(ref_subdiv,local_114,local_110,&local_a4);
                if (uVar3 != 0) {
                  pcVar12 = "mis";
                  uVar8 = 0x4af;
                  goto LAB_00207a31;
                }
                uVar3 = ref_subdiv_node_between(ref_subdiv,local_110,local_118,&local_a0);
                if (uVar3 != 0) {
                  pcVar12 = "mis";
                  uVar8 = 0x4b2;
                  goto LAB_00207a31;
                }
                uVar3 = ref_cell_add(local_138,&local_a8,&local_13c);
                if (uVar3 != 0) {
                  pcVar12 = "add";
                  uVar8 = 0x4b3;
                  goto LAB_00207a31;
                }
              }
LAB_002082a9:
              lVar11 = lVar11 + 1;
              uVar6 = (ulong)pRVar1->max;
            } while (lVar11 < (long)uVar6);
            if (0 < pRVar1->max) {
              lVar11 = 0;
              do {
                if (*(int *)((long)__s + lVar11 * 4) == 1) {
                  uVar3 = ref_cell_remove(pRVar1,(REF_INT)lVar11);
                  if (uVar3 != 0) {
                    pcVar12 = "remove";
                    uVar8 = 0x536;
                    goto LAB_00207a31;
                  }
                  uVar6 = (ulong)(uint)pRVar1->max;
                }
                lVar11 = lVar11 + 1;
              } while (lVar11 < (int)uVar6);
            }
          }
          if (0 < local_138->max) {
            RVar9 = 0;
            do {
              RVar4 = ref_cell_nodes(local_138,RVar9,&local_118);
              if ((RVar4 == 0) &&
                 (uVar3 = ref_subdiv_add_local_cell((REF_SUBDIV)ref_subdiv->grid,pRVar1,&local_118),
                 uVar3 != 0)) {
                pcVar12 = "add local";
                uVar8 = 0x539;
                goto LAB_00207a31;
              }
              RVar9 = RVar9 + 1;
            } while (RVar9 < local_138->max);
          }
          pRVar1 = local_38;
          if (0 < local_128->max) {
            iVar10 = 0;
            do {
              RVar4 = ref_cell_nodes(local_128,iVar10,&local_118);
              if ((RVar4 == 0) &&
                 (uVar3 = ref_subdiv_add_local_cell((REF_SUBDIV)ref_subdiv->grid,pRVar1,&local_118),
                 uVar3 != 0)) {
                pcVar12 = "add local";
                uVar8 = 0x53c;
                goto LAB_00207a31;
              }
              iVar10 = iVar10 + 1;
            } while (iVar10 < local_128->max);
          }
          uVar3 = ref_cell_free(local_138);
          if (uVar3 == 0) {
            uVar3 = ref_cell_free(local_128);
            if (uVar3 == 0) {
              free(__s);
              return 0;
            }
            pcVar12 = "temp qua free";
            uVar8 = 0x53f;
          }
          else {
            pcVar12 = "temp tri free";
            uVar8 = 0x53e;
          }
        }
        else {
          pcVar12 = "temp qua";
          uVar8 = 0x47b;
        }
      }
      else {
        pcVar12 = "temp tri";
        uVar8 = 0x478;
      }
LAB_00207a31:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             uVar8,"ref_subdiv_split_tri",(ulong)uVar3,pcVar12);
    }
  }
  return uVar3;
}

Assistant:

REF_FCN static REF_STATUS ref_subdiv_split_tri(REF_SUBDIV ref_subdiv) {
  REF_INT cell;
  REF_CELL tri, qua;
  REF_CELL tri_split, qua_split;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT new_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT new_cell;
  REF_INT *marked_for_removal;

  REF_INT edge01, edge12, edge20;

  tri = ref_grid_tri(ref_subdiv_grid(ref_subdiv));

  ref_malloc_init(marked_for_removal, ref_cell_max(tri), REF_INT, 0);

  RSS(ref_cell_create(&tri_split, ref_cell_type(tri)), "temp tri");

  qua = ref_grid_qua(ref_subdiv_grid(ref_subdiv));
  RSS(ref_cell_create(&qua_split, ref_cell_type(qua)), "temp qua");

  each_ref_cell_valid_cell(tri, cell) {
    RSS(ref_cell_nodes(tri, cell, nodes), "nodes");
    RSS(ref_edge_with(ref_subdiv_edge(ref_subdiv), nodes[0], nodes[1], &edge01),
        "e01");
    RSS(ref_edge_with(ref_subdiv_edge(ref_subdiv), nodes[1], nodes[2], &edge12),
        "e12");
    RSS(ref_edge_with(ref_subdiv_edge(ref_subdiv), nodes[2], nodes[0], &edge20),
        "e20");

    if (ref_subdiv_mark(ref_subdiv, edge01) &&
        ref_subdiv_mark(ref_subdiv, edge12) &&
        ref_subdiv_mark(ref_subdiv, edge20)) {
      marked_for_removal[cell] = 1;
      /* near node 0 */
      RSS(ref_cell_nodes(tri, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                  &(new_nodes[1])),
          "mis");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[2],
                                  &(new_nodes[2])),
          "mis");
      RSS(ref_cell_add(tri_split, new_nodes, &new_cell), "add");

      /* near node 1 */
      RSS(ref_cell_nodes(tri, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[0],
                                  &(new_nodes[0])),
          "mis");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                  &(new_nodes[2])),
          "mis");
      RSS(ref_cell_add(tri_split, new_nodes, &new_cell), "add");

      /* near node 2 */
      RSS(ref_cell_nodes(tri, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[1],
                                  &(new_nodes[1])),
          "mis");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[0],
                                  &(new_nodes[0])),
          "mis");
      RSS(ref_cell_add(tri_split, new_nodes, &new_cell), "add");

      /* center */
      RSS(ref_cell_nodes(tri, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                  &(new_nodes[0])),
          "mis");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                  &(new_nodes[1])),
          "mis");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[0],
                                  &(new_nodes[2])),
          "mis");
      RSS(ref_cell_add(tri_split, new_nodes, &new_cell), "add");
      continue;
    }

    /*
      2   3-2
      |\  | |
      0-1 0-1
     */

    if (ref_subdiv_mark(ref_subdiv, edge01) &&
        ref_subdiv_mark(ref_subdiv, edge12) &&
        !ref_subdiv_mark(ref_subdiv, edge20)) {
      marked_for_removal[cell] = 1;
      RSS(ref_cell_nodes(tri, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                  &(new_nodes[2])),
          "mis");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[0],
                                  &(new_nodes[0])),
          "mis");
      RSS(ref_cell_add(tri_split, new_nodes, &new_cell), "add");

      RSS(ref_cell_nodes(tri, cell, new_nodes), "nodes");
      new_nodes[4] = new_nodes[3]; /* faceid */
      new_nodes[3] = new_nodes[2]; /* last node */
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                  &(new_nodes[2])),
          "mis");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[0],
                                  &(new_nodes[1])),
          "mis");
      RSS(ref_cell_add(qua_split, new_nodes, &new_cell), "add");
      continue;
    }

    if (ref_subdiv_mark(ref_subdiv, edge12) &&
        ref_subdiv_mark(ref_subdiv, edge20) &&
        !ref_subdiv_mark(ref_subdiv, edge01)) {
      marked_for_removal[cell] = 1;
      RSS(ref_cell_nodes(tri, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[1],
                                  &(new_nodes[1])),
          "mis");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[0],
                                  &(new_nodes[0])),
          "mis");
      RSS(ref_cell_add(tri_split, new_nodes, &new_cell), "add");

      RSS(ref_cell_nodes(tri, cell, new_nodes), "nodes");
      new_nodes[4] = new_nodes[3]; /* faceid */
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[1],
                                  &(new_nodes[2])),
          "mis");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[0],
                                  &(new_nodes[3])),
          "mis");
      RSS(ref_cell_add(qua_split, new_nodes, &new_cell), "add");
      continue;
    }

    if (ref_subdiv_mark(ref_subdiv, edge20) &&
        ref_subdiv_mark(ref_subdiv, edge01) &&
        !ref_subdiv_mark(ref_subdiv, edge12)) {
      marked_for_removal[cell] = 1;
      RSS(ref_cell_nodes(tri, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                  &(new_nodes[1])),
          "mis");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[2],
                                  &(new_nodes[2])),
          "mis");
      RSS(ref_cell_add(tri_split, new_nodes, &new_cell), "add");

      RSS(ref_cell_nodes(tri, cell, new_nodes), "nodes");
      new_nodes[4] = new_nodes[3]; /* faceid */
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                  &(new_nodes[0])),
          "mis");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[2],
                                  &(new_nodes[3])),
          "mis");
      RSS(ref_cell_add(qua_split, new_nodes, &new_cell), "add");
      continue;
    }

    if (ref_subdiv_mark(ref_subdiv, edge01)) {
      marked_for_removal[cell] = 1;
      RSS(ref_cell_nodes(tri, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                  &(new_nodes[0])),
          "mis");
      RSS(ref_cell_add(tri_split, new_nodes, &new_cell), "add");
      RSS(ref_cell_nodes(tri, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                  &(new_nodes[1])),
          "mis");
      RSS(ref_cell_add(tri_split, new_nodes, &new_cell), "add");
    }

    if (ref_subdiv_mark(ref_subdiv, edge12)) {
      marked_for_removal[cell] = 1;
      RSS(ref_cell_nodes(tri, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                  &(new_nodes[1])),
          "mis");
      RSS(ref_cell_add(tri_split, new_nodes, &new_cell), "add");
      RSS(ref_cell_nodes(tri, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                  &(new_nodes[2])),
          "mis");
      RSS(ref_cell_add(tri_split, new_nodes, &new_cell), "add");
    }

    if (ref_subdiv_mark(ref_subdiv, edge20)) {
      marked_for_removal[cell] = 1;
      RSS(ref_cell_nodes(tri, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[0],
                                  &(new_nodes[2])),
          "mis");
      RSS(ref_cell_add(tri_split, new_nodes, &new_cell), "add");
      RSS(ref_cell_nodes(tri, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[0],
                                  &(new_nodes[0])),
          "mis");
      RSS(ref_cell_add(tri_split, new_nodes, &new_cell), "add");
    }
  }

  for (cell = 0; cell < ref_cell_max(tri); cell++)
    if (1 == marked_for_removal[cell])
      RSS(ref_cell_remove(tri, cell), "remove");

  each_ref_cell_valid_cell_with_nodes(tri_split, cell, nodes)
      RSS(ref_subdiv_add_local_cell(ref_subdiv, tri, nodes), "add local");

  each_ref_cell_valid_cell_with_nodes(qua_split, cell, nodes)
      RSS(ref_subdiv_add_local_cell(ref_subdiv, qua, nodes), "add local");

  RSS(ref_cell_free(tri_split), "temp tri free");
  RSS(ref_cell_free(qua_split), "temp qua free");

  free(marked_for_removal);

  return REF_SUCCESS;
}